

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Geometry.cpp
# Opt level: O2

void __thiscall Assimp::AMFImporter::ParseNode_Triangle(AMFImporter *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  CAMFImporter_NodeElement_Triangle *this_00;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  DeadlyImportError *this_01;
  allocator<char> local_96;
  allocator<char> local_95;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  string local_80;
  CAMFImporter_NodeElement_Triangle *local_60;
  CAMFImporter_NodeElement *ne;
  string local_50;
  
  this_00 = (CAMFImporter_NodeElement_Triangle *)operator_new(0x68);
  CAMFImporter_NodeElement_Triangle::CAMFImporter_NodeElement_Triangle
            (this_00,this->mNodeElement_Cur);
  ne = (CAMFImporter_NodeElement *)this_00;
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar3 == '\0') {
    local_60 = this_00;
    ParseHelper_Node_Enter(this,(CAMFImporter_NodeElement *)this_00);
    local_84 = 0;
    local_94 = 0;
    local_88 = 0;
    local_8c = 0;
    local_90 = 0;
LAB_003ba420:
    do {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar3 == '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"triangle",(allocator<char> *)&local_50);
        Throw_CloseNotFound(this,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        break;
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar3 == 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"color",(allocator<char> *)&local_50);
        bVar1 = XML_CheckNode_NameEqual(this,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        if (bVar1) {
          if ((local_84 & 1) != 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_80,"color",&local_95);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,"Only one color can be defined for <triangle>.",&local_96
                      );
            Throw_MoreThanOnceDefined(this,&local_80,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_80);
          }
          ParseNode_Color(this);
          local_84 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          goto LAB_003ba420;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"texmap",(allocator<char> *)&local_50);
        bVar1 = XML_CheckNode_NameEqual(this,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        if (bVar1) {
          if ((local_94 & 1) != 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_80,"texmap",&local_95);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,
                       "Only one texture coordinate can be defined for <triangle>.",&local_96);
            Throw_MoreThanOnceDefined(this,&local_80,&local_50);
LAB_003ba6bf:
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_80);
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,"map",(allocator<char> *)&local_50);
          bVar2 = XML_CheckNode_NameEqual(this,&local_80);
          std::__cxx11::string::~string((string *)&local_80);
          if (!bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_80,"v1",(allocator<char> *)&local_50);
            bVar1 = XML_CheckNode_NameEqual(this,&local_80);
            std::__cxx11::string::~string((string *)&local_80);
            if (bVar1) {
              if ((local_88 & 1) != 0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_80,"v1",&local_95);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_50,"Only one component can be defined.",&local_96);
                Throw_MoreThanOnceDefined(this,&local_80,&local_50);
                std::__cxx11::string::~string((string *)&local_50);
                std::__cxx11::string::~string((string *)&local_80);
              }
              uVar4 = XML_ReadNode_GetVal_AsU32(this);
              local_60->V[0] = (ulong)uVar4;
              local_88 = (uint)CONCAT71((uint7)(uint3)(uVar4 >> 8),1);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_80,"v2",(allocator<char> *)&local_50);
              bVar1 = XML_CheckNode_NameEqual(this,&local_80);
              std::__cxx11::string::~string((string *)&local_80);
              if (bVar1) {
                if ((local_8c & 1) != 0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_80,"v2",&local_95);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_50,"Only one component can be defined.",&local_96);
                  Throw_MoreThanOnceDefined(this,&local_80,&local_50);
                  std::__cxx11::string::~string((string *)&local_50);
                  std::__cxx11::string::~string((string *)&local_80);
                }
                uVar4 = XML_ReadNode_GetVal_AsU32(this);
                local_60->V[1] = (ulong)uVar4;
                local_8c = (uint)CONCAT71((uint7)(uint3)(uVar4 >> 8),1);
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_80,"v3",(allocator<char> *)&local_50);
                bVar1 = XML_CheckNode_NameEqual(this,&local_80);
                std::__cxx11::string::~string((string *)&local_80);
                if (bVar1) {
                  if ((local_90 & 1) != 0) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_80,"v3",&local_95);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_50,"Only one component can be defined.",&local_96);
                    Throw_MoreThanOnceDefined(this,&local_80,&local_50);
                    std::__cxx11::string::~string((string *)&local_50);
                    std::__cxx11::string::~string((string *)&local_80);
                  }
                  uVar4 = XML_ReadNode_GetVal_AsU32(this);
                  local_60->V[2] = (ulong)uVar4;
                  local_90 = (uint)CONCAT71((uint7)(uint3)(uVar4 >> 8),1);
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_80,"triangle",(allocator<char> *)&local_50);
                  XML_CheckNode_SkipUnsupported(this,&local_80);
                  std::__cxx11::string::~string((string *)&local_80);
                }
              }
            }
            goto LAB_003ba420;
          }
          if ((local_94 & 1) != 0) {
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"map",&local_95);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,
                       "Only one texture coordinate can be defined for <triangle>.",&local_96);
            Throw_MoreThanOnceDefined(this,&local_80,&local_50);
            goto LAB_003ba6bf;
          }
        }
        ParseNode_TexMap(this,!bVar1);
        local_94 = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
        goto LAB_003ba420;
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar3 != 2) goto LAB_003ba420;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"triangle",(allocator<char> *)&local_50);
      bVar1 = XML_CheckNode_NameEqual(this,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    } while (!bVar1);
    ParseHelper_Node_Exit(this);
    if ((((local_88 & 1) == 0) || ((local_8c & 1) == 0)) || ((char)local_90 == '\0')) {
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"Not all vertices of the triangle are defined.",
                 (allocator<char> *)&local_50);
      DeadlyImportError::DeadlyImportError(this_01,&local_80);
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
    push_back(&this->mNodeElement_Cur->Child,&ne);
  }
  std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
  push_back(&this->mNodeElement_List,&ne);
  return;
}

Assistant:

void AMFImporter::ParseNode_Triangle()
{
CAMFImporter_NodeElement* ne;

	// create new color object.
	ne = new CAMFImporter_NodeElement_Triangle(mNodeElement_Cur);

	CAMFImporter_NodeElement_Triangle& als = *((CAMFImporter_NodeElement_Triangle*)ne);// alias for convenience

	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool col_read = false, tex_read = false;
		bool read_flag[3] = { false, false, false };

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("triangle");
			if(XML_CheckNode_NameEqual("color"))
			{
				// Check if data already defined.
				if(col_read) Throw_MoreThanOnceDefined("color", "Only one color can be defined for <triangle>.");
				// read data and set flag about it
				ParseNode_Color();
				col_read = true;

				continue;
			}

			if(XML_CheckNode_NameEqual("texmap"))// new name of node: "texmap".
			{
				// Check if data already defined.
				if(tex_read) Throw_MoreThanOnceDefined("texmap", "Only one texture coordinate can be defined for <triangle>.");
				// read data and set flag about it
				ParseNode_TexMap();
				tex_read = true;

				continue;
			}
			else if(XML_CheckNode_NameEqual("map"))// old name of node: "map".
			{
				// Check if data already defined.
				if(tex_read) Throw_MoreThanOnceDefined("map", "Only one texture coordinate can be defined for <triangle>.");
				// read data and set flag about it
				ParseNode_TexMap(true);
				tex_read = true;

				continue;
			}

			MACRO_NODECHECK_READCOMP_U32("v1", read_flag[0], als.V[0]);
			MACRO_NODECHECK_READCOMP_U32("v2", read_flag[1], als.V[1]);
			MACRO_NODECHECK_READCOMP_U32("v3", read_flag[2], als.V[2]);
		MACRO_NODECHECK_LOOPEND("triangle");
		ParseHelper_Node_Exit();
		// check that all components was defined
		if((read_flag[0] && read_flag[1] && read_flag[2]) == 0) throw DeadlyImportError("Not all vertices of the triangle are defined.");

	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}